

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprCodeInlineFunction(Parse *pParse,ExprList *pFarg,int iFuncId,int target)

{
  int iVar1;
  Vdbe *pVVar2;
  char cVar3;
  int in_ECX;
  undefined4 in_EDX;
  int *in_RSI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  char aff;
  Expr *pA1;
  int i;
  int endCoalesce;
  Vdbe *v;
  int nFarg;
  Expr caseExpr;
  char *azAff [6];
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  Vdbe *in_stack_ffffffffffffff00;
  char *zStr;
  Parse *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int local_b8;
  int local_a0;
  int local_84;
  undefined1 local_80 [72];
  undefined8 local_38 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pVVar2 = in_RDI->pVdbe;
  iVar1 = *in_RSI;
  local_a0 = in_ECX;
  switch(in_EDX) {
  case 0:
    sqlite3VdbeMakeLabel(in_RDI);
    sqlite3ExprCode((Parse *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                    (Expr *)in_stack_ffffffffffffff08,
                    (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    for (local_b8 = 1; local_b8 < iVar1; local_b8 = local_b8 + 1) {
      sqlite3VdbeAddOp2(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                        in_stack_fffffffffffffef8,0);
      sqlite3ExprCode((Parse *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (Expr *)in_stack_ffffffffffffff08,
                      (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    }
    setDoNotMergeFlagOnCopy((Vdbe *)0x1cc6d7);
    sqlite3VdbeResolveLabel
              ((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    break;
  case 1:
    if (**(char **)(in_RSI + 8) == -0x58) {
      sqlite3ExprImpliesNonNullRow
                ((Expr *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                 in_stack_fffffffffffffef8);
      sqlite3VdbeAddOp2(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                        in_stack_fffffffffffffef8,0);
    }
    else {
      sqlite3VdbeAddOp2(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                        in_stack_fffffffffffffef8,0);
    }
    break;
  case 2:
    sqlite3ExprImpliesExpr
              (in_stack_ffffffffffffff08,(Expr *)in_stack_ffffffffffffff00,
               (Expr *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0);
    sqlite3VdbeAddOp2(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                      0);
    break;
  case 3:
    sqlite3ExprCompare(in_stack_ffffffffffffff08,(Expr *)in_stack_ffffffffffffff00,
                       (Expr *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0);
    sqlite3VdbeAddOp2(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                      0);
    break;
  case 4:
    memcpy(local_38,&DAT_002e5410,0x30);
    cVar3 = sqlite3ExprAffinity((Expr *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                                                ));
    if (cVar3 < 'A') {
      zStr = "none";
    }
    else {
      zStr = (char *)local_38[cVar3 + -0x41];
    }
    sqlite3VdbeLoadString
              ((Vdbe *)CONCAT44(in_ECX,in_stack_ffffffffffffff10),(int)((ulong)pVVar2 >> 0x20),zStr)
    ;
    break;
  case 5:
    memset(local_80,0xaa,0x48);
    memset(local_80,0,0x48);
    local_80[0] = 0x9e;
    local_84 = sqlite3ExprCodeTarget((Parse *)azAff[1],(Expr *)azAff[0],caseExpr.y.sub.regReturn);
    goto LAB_001cc906;
  default:
    local_a0 = sqlite3ExprCodeTarget((Parse *)azAff[1],(Expr *)azAff[0],caseExpr.y.sub.regReturn);
  }
  local_84 = local_a0;
LAB_001cc906:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_84;
}

Assistant:

static int exprCodeInlineFunction(
  Parse *pParse,        /* Parsing context */
  ExprList *pFarg,      /* List of function arguments */
  int iFuncId,          /* Function ID.  One of the INTFUNC_... values */
  int target            /* Store function result in this register */
){
  int nFarg;
  Vdbe *v = pParse->pVdbe;
  assert( v!=0 );
  assert( pFarg!=0 );
  nFarg = pFarg->nExpr;
  assert( nFarg>0 );  /* All in-line functions have at least one argument */
  switch( iFuncId ){
    case INLINEFUNC_coalesce: {
      /* Attempt a direct implementation of the built-in COALESCE() and
      ** IFNULL() functions.  This avoids unnecessary evaluation of
      ** arguments past the first non-NULL argument.
      */
      int endCoalesce = sqlite3VdbeMakeLabel(pParse);
      int i;
      assert( nFarg>=2 );
      sqlite3ExprCode(pParse, pFarg->a[0].pExpr, target);
      for(i=1; i<nFarg; i++){
        sqlite3VdbeAddOp2(v, OP_NotNull, target, endCoalesce);
        VdbeCoverage(v);
        sqlite3ExprCode(pParse, pFarg->a[i].pExpr, target);
      }
      setDoNotMergeFlagOnCopy(v);
      sqlite3VdbeResolveLabel(v, endCoalesce);
      break;
    }
    case INLINEFUNC_iif: {
      Expr caseExpr;
      memset(&caseExpr, 0, sizeof(caseExpr));
      caseExpr.op = TK_CASE;
      caseExpr.x.pList = pFarg;
      return sqlite3ExprCodeTarget(pParse, &caseExpr, target);
    }
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
    case INLINEFUNC_sqlite_offset: {
      Expr *pArg = pFarg->a[0].pExpr;
      if( pArg->op==TK_COLUMN && pArg->iTable>=0 ){
        sqlite3VdbeAddOp3(v, OP_Offset, pArg->iTable, pArg->iColumn, target);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      }
      break;
    }
#endif
    default: {
      /* The UNLIKELY() function is a no-op.  The result is the value
      ** of the first argument.
      */
      assert( nFarg==1 || nFarg==2 );
      target = sqlite3ExprCodeTarget(pParse, pFarg->a[0].pExpr, target);
      break;
    }

  /***********************************************************************
  ** Test-only SQL functions that are only usable if enabled
  ** via SQLITE_TESTCTRL_INTERNAL_FUNCTIONS
  */
#if !defined(SQLITE_UNTESTABLE)
    case INLINEFUNC_expr_compare: {
      /* Compare two expressions using sqlite3ExprCompare() */
      assert( nFarg==2 );
      sqlite3VdbeAddOp2(v, OP_Integer,
         sqlite3ExprCompare(0,pFarg->a[0].pExpr, pFarg->a[1].pExpr,-1),
         target);
      break;
    }

    case INLINEFUNC_expr_implies_expr: {
      /* Compare two expressions using sqlite3ExprImpliesExpr() */
      assert( nFarg==2 );
      sqlite3VdbeAddOp2(v, OP_Integer,
         sqlite3ExprImpliesExpr(pParse,pFarg->a[0].pExpr, pFarg->a[1].pExpr,-1),
         target);
      break;
    }

    case INLINEFUNC_implies_nonnull_row: {
      /* Result of sqlite3ExprImpliesNonNullRow() */
      Expr *pA1;
      assert( nFarg==2 );
      pA1 = pFarg->a[1].pExpr;
      if( pA1->op==TK_COLUMN ){
        sqlite3VdbeAddOp2(v, OP_Integer,
           sqlite3ExprImpliesNonNullRow(pFarg->a[0].pExpr,pA1->iTable,1),
           target);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      }
      break;
    }

    case INLINEFUNC_affinity: {
      /* The AFFINITY() function evaluates to a string that describes
      ** the type affinity of the argument.  This is used for testing of
      ** the SQLite type logic.
      */
      const char *azAff[] = { "blob", "text", "numeric", "integer",
                              "real", "flexnum" };
      char aff;
      assert( nFarg==1 );
      aff = sqlite3ExprAffinity(pFarg->a[0].pExpr);
      assert( aff<=SQLITE_AFF_NONE
           || (aff>=SQLITE_AFF_BLOB && aff<=SQLITE_AFF_FLEXNUM) );
      sqlite3VdbeLoadString(v, target,
              (aff<=SQLITE_AFF_NONE) ? "none" : azAff[aff-SQLITE_AFF_BLOB]);
      break;
    }
#endif /* !defined(SQLITE_UNTESTABLE) */
  }
  return target;
}